

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar14;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined8 uVar20;
  undefined8 uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  unsigned_long uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined4 uVar70;
  undefined1 auVar71 [32];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined4 uVar77;
  undefined1 auVar78 [32];
  undefined4 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  size_t local_168;
  size_t local_160;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar25 = r->_begin;
  auVar43._8_4_ = 0x7f800000;
  auVar43._0_8_ = 0x7f8000007f800000;
  auVar43._12_4_ = 0x7f800000;
  auVar66 = ZEXT1664(auVar43);
  auVar44._8_4_ = 0xff800000;
  auVar44._0_8_ = 0xff800000ff800000;
  auVar44._12_4_ = 0xff800000;
  auVar65 = ZEXT1664(auVar44);
  local_168 = 0;
  auVar69._8_4_ = 0x7fffffff;
  auVar69._0_8_ = 0x7fffffff7fffffff;
  auVar69._12_4_ = 0x7fffffff;
  auVar80._8_4_ = 0x7fffffff;
  auVar80._0_8_ = 0x7fffffff7fffffff;
  auVar80._12_4_ = 0x7fffffff;
  auVar81._8_4_ = 0xddccb9a2;
  auVar81._0_8_ = 0xddccb9a2ddccb9a2;
  auVar81._12_4_ = 0xddccb9a2;
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
  auVar82 = ZEXT1664(auVar44);
  auVar83 = ZEXT1664(auVar43);
  local_160 = k;
  while( true ) {
    if (r->_end <= uVar25) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = auVar83._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = auVar82._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar66._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar65._0_16_;
      __return_storage_ptr__->end = local_168;
      return __return_storage_ptr__;
    }
    pBVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             vertices.items;
    uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                               super_CurveGeometry.field_0x68 * uVar25);
    uVar23 = (ulong)(uVar1 + 3);
    if (uVar23 < (pBVar2->super_RawBufferView).num) break;
LAB_01c1ae07:
    uVar25 = uVar25 + 1;
  }
  lVar27 = 0;
LAB_01c1aa1d:
  if ((ulong)((this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
              super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 == lVar27 + 0x38) {
    pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
    sVar4 = (pBVar2->super_RawBufferView).stride;
    lVar27 = uVar1 * sVar4;
    auVar44 = *(undefined1 (*) [16])(pcVar3 + lVar27);
    lVar29 = (uVar1 + 1) * sVar4;
    auVar43 = *(undefined1 (*) [16])(pcVar3 + lVar29);
    lVar28 = (uVar1 + 2) * sVar4;
    auVar40 = *(undefined1 (*) [16])(pcVar3 + lVar28);
    auVar41 = *(undefined1 (*) [16])(pcVar3 + uVar23 * sVar4);
    fVar72 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             maxRadiusScale;
    auVar31 = vmulss_avx512f(ZEXT416((uint)fVar72),ZEXT416(*(uint *)(pcVar3 + lVar27 + 0xc)));
    fVar16 = fVar72 * *(float *)(pcVar3 + lVar29 + 0xc);
    fVar17 = fVar72 * *(float *)(pcVar3 + lVar28 + 0xc);
    fVar72 = fVar72 * *(float *)(pcVar3 + uVar23 * sVar4 + 0xc);
    lVar27 = (long)(this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                   tessellationRate;
    if (lVar27 == 4) {
      auVar42._4_4_ = fVar72;
      auVar42._0_4_ = fVar72;
      auVar42._8_4_ = fVar72;
      auVar42._12_4_ = fVar72;
      auVar13 = vblendps_avx(auVar41,auVar42,8);
      auVar75._4_4_ = fVar17;
      auVar75._0_4_ = fVar17;
      auVar75._8_4_ = fVar17;
      auVar75._12_4_ = fVar17;
      auVar67 = vblendps_avx(auVar40,auVar75,8);
      auVar73._4_4_ = fVar16;
      auVar73._0_4_ = fVar16;
      auVar73._8_4_ = fVar16;
      auVar73._12_4_ = fVar16;
      auVar74 = vblendps_avx(auVar43,auVar73,8);
      auVar32 = vbroadcastss_avx512vl(auVar44);
      auVar33 = vshufps_avx512vl(auVar44,auVar44,0x55);
      auVar34 = vshufps_avx512vl(auVar44,auVar44,0xaa);
      auVar31 = vbroadcastss_avx512vl(auVar31);
      auVar35 = vbroadcastss_avx512vl(auVar43);
      auVar36 = vshufps_avx512vl(auVar43,auVar43,0x55);
      auVar44 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar37 = vbroadcastss_avx512vl(auVar40);
      auVar38 = vshufps_avx512vl(auVar40,auVar40,0x55);
      auVar43 = vshufps_avx(auVar40,auVar40,0xaa);
      auVar39 = vbroadcastss_avx512vl(auVar41);
      auVar40 = vshufps_avx(auVar41,auVar41,0x55);
      auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
      auVar39 = vmulps_avx512vl(auVar39,bspline_basis0._3740_16_);
      auVar40 = vmulps_avx512vl(auVar40,bspline_basis0._3740_16_);
      auVar41 = vmulps_avx512vl(auVar41,bspline_basis0._3740_16_);
      auVar42 = vmulps_avx512vl(auVar42,bspline_basis0._3740_16_);
      auVar37 = vfmadd231ps_avx512vl(auVar39,bspline_basis0._2584_16_,auVar37);
      auVar40 = vfmadd231ps_avx512vl(auVar40,bspline_basis0._2584_16_,auVar38);
      auVar43 = vfmadd231ps_avx512vl(auVar41,bspline_basis0._2584_16_,auVar43);
      auVar41 = vfmadd231ps_avx512vl(auVar42,bspline_basis0._2584_16_,auVar75);
      auVar35 = vfmadd231ps_avx512vl(auVar37,bspline_basis0._1428_16_,auVar35);
      auVar40 = vfmadd231ps_avx512vl(auVar40,bspline_basis0._1428_16_,auVar36);
      auVar44 = vfmadd231ps_avx512vl(auVar43,bspline_basis0._1428_16_,auVar44);
      auVar43 = vfmadd231ps_avx512vl(auVar41,bspline_basis0._1428_16_,auVar73);
      auVar32 = vfmadd231ps_avx512vl(auVar35,bspline_basis0._272_16_,auVar32);
      auVar33 = vfmadd231ps_avx512vl(auVar40,bspline_basis0._272_16_,auVar33);
      auVar34 = vfmadd231ps_avx512vl(auVar44,bspline_basis0._272_16_,auVar34);
      auVar35 = vfmadd231ps_avx512vl(auVar43,bspline_basis0._272_16_,auVar31);
      auVar36 = vshufps_avx512vl(auVar32,auVar32,0xb1);
      auVar43 = vminps_avx512vl(auVar36,auVar32);
      auVar44 = vshufpd_avx(auVar43,auVar43,1);
      auVar44 = vminps_avx(auVar44,auVar43);
      auVar40 = vshufps_avx(auVar33,auVar33,0xb1);
      auVar43 = vminps_avx(auVar40,auVar33);
      auVar41 = vshufpd_avx512vl(auVar43,auVar43,1);
      auVar43 = vminps_avx512vl(auVar41,auVar43);
      auVar44 = vinsertps_avx(auVar44,auVar43,0x1c);
      auVar41 = vshufps_avx(auVar34,auVar34,0xb1);
      auVar43 = vminps_avx512vl(auVar41,auVar34);
      auVar31 = vshufpd_avx512vl(auVar43,auVar43,1);
      auVar43 = vminps_avx512vl(auVar31,auVar43);
      auVar31 = vinsertps_avx512f(auVar44,auVar43,0x20);
      auVar44 = vmaxps_avx512vl(auVar36,auVar32);
      auVar43 = vshufpd_avx512vl(auVar44,auVar44,1);
      auVar32 = vmaxps_avx512vl(auVar43,auVar44);
      auVar44 = vmaxps_avx(auVar40,auVar33);
      auVar43 = vshufpd_avx(auVar44,auVar44,1);
      auVar44 = vmaxps_avx(auVar43,auVar44);
      auVar44 = vinsertps_avx(auVar32,auVar44,0x1c);
      auVar43 = vmaxps_avx(auVar41,auVar34);
      auVar40 = vshufpd_avx(auVar43,auVar43,1);
      auVar43 = vmaxps_avx(auVar40,auVar43);
      auVar43 = vinsertps_avx(auVar44,auVar43,0x20);
      auVar44 = vandps_avx(auVar35,auVar69);
      auVar40 = vprolq_avx512vl(auVar44,0x20);
      auVar44 = vmaxps_avx(auVar40,auVar44);
      uVar70 = auVar44._0_4_;
      auVar32._4_4_ = uVar70;
      auVar32._0_4_ = uVar70;
      auVar32._8_4_ = uVar70;
      auVar32._12_4_ = uVar70;
      auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
      auVar40 = vmaxps_avx(auVar44,auVar32);
      auVar34._8_4_ = 0x3e2aaaab;
      auVar34._0_8_ = 0x3e2aaaab3e2aaaab;
      auVar34._12_4_ = 0x3e2aaaab;
      auVar33._0_4_ = auVar13._0_4_ * 0.16666667;
      auVar33._4_4_ = auVar13._4_4_ * 0.16666667;
      auVar33._8_4_ = auVar13._8_4_ * 0.16666667;
      auVar33._12_4_ = auVar13._12_4_ * 0.16666667;
      auVar13._8_4_ = 0x3f2aaaab;
      auVar13._0_8_ = 0x3f2aaaab3f2aaaab;
      auVar13._12_4_ = 0x3f2aaaab;
      auVar44 = vfmadd231ps_avx512vl(auVar33,auVar67,auVar13);
      auVar44 = vfmadd231ps_fma(auVar44,auVar34,auVar74);
      auVar31 = vminps_avx(auVar31,auVar44);
      auVar43 = vmaxps_avx(auVar43,auVar44);
      auVar44 = vshufps_avx(auVar44,auVar44,0xff);
      auVar44 = vandps_avx(auVar44,auVar69);
      auVar41 = vmaxps_avx(auVar40,auVar44);
      auVar44 = vsubps_avx(auVar31,auVar41);
      auVar40._0_4_ = auVar43._0_4_ + auVar41._0_4_;
      auVar40._4_4_ = auVar43._4_4_ + auVar41._4_4_;
      auVar40._8_4_ = auVar43._8_4_ + auVar41._8_4_;
      auVar40._12_4_ = auVar43._12_4_ + auVar41._12_4_;
    }
    else {
      auVar45 = vpbroadcastd_avx512vl();
      auVar46 = vbroadcastss_avx512vl(auVar44);
      auVar68._8_4_ = 1;
      auVar68._0_8_ = 0x100000001;
      auVar68._12_4_ = 1;
      auVar68._16_4_ = 1;
      auVar68._20_4_ = 1;
      auVar68._24_4_ = 1;
      auVar68._28_4_ = 1;
      auVar47 = vpermps_avx512vl(auVar68,ZEXT1632(auVar44));
      auVar71._8_4_ = 2;
      auVar71._0_8_ = 0x200000002;
      auVar71._12_4_ = 2;
      auVar71._16_4_ = 2;
      auVar71._20_4_ = 2;
      auVar71._24_4_ = 2;
      auVar71._28_4_ = 2;
      auVar48 = vpermps_avx512vl(auVar71,ZEXT1632(auVar44));
      auVar49 = vbroadcastss_avx512vl(auVar31);
      uVar79 = auVar43._0_4_;
      auVar63 = vpermps_avx2(auVar68,ZEXT1632(auVar43));
      auVar64 = vpermps_avx2(auVar71,ZEXT1632(auVar43));
      uVar77 = auVar40._0_4_;
      auVar18 = vpermps_avx2(auVar68,ZEXT1632(auVar40));
      auVar19 = vpermps_avx2(auVar71,ZEXT1632(auVar40));
      auVar76._4_4_ = fVar17;
      auVar76._0_4_ = fVar17;
      auVar76._8_4_ = fVar17;
      auVar76._12_4_ = fVar17;
      auVar76._16_4_ = fVar17;
      auVar76._20_4_ = fVar17;
      auVar76._24_4_ = fVar17;
      auVar76._28_4_ = fVar17;
      uVar70 = auVar41._0_4_;
      auVar78._4_4_ = uVar70;
      auVar78._0_4_ = uVar70;
      auVar78._8_4_ = uVar70;
      auVar78._12_4_ = uVar70;
      auVar78._16_4_ = uVar70;
      auVar78._20_4_ = uVar70;
      auVar78._24_4_ = uVar70;
      auVar78._28_4_ = uVar70;
      auVar68 = vpermps_avx2(auVar68,ZEXT1632(auVar41));
      auVar71 = vpermps_avx2(auVar71,ZEXT1632(auVar41));
      lVar28 = lVar27 * 0x44;
      auVar44 = vxorps_avx512vl(auVar44,auVar44);
      auVar85 = ZEXT1664(auVar44);
      lVar29 = 0;
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar60._8_4_ = 0x7f800000;
      auVar60._0_8_ = 0x7f8000007f800000;
      auVar60._12_4_ = 0x7f800000;
      auVar60._16_4_ = 0x7f800000;
      auVar60._20_4_ = 0x7f800000;
      auVar60._24_4_ = 0x7f800000;
      auVar60._28_4_ = 0x7f800000;
      auVar59 = auVar60;
      auVar51 = auVar50;
      auVar58 = auVar60;
      auVar62 = auVar50;
      for (; auVar84 = auVar85._0_32_, lVar29 <= lVar27; lVar29 = lVar29 + 8) {
        auVar52 = vpbroadcastd_avx512vl();
        auVar52 = vpor_avx2(auVar52,_DAT_01fb4ba0);
        uVar23 = vpcmpgtd_avx512vl(auVar52,auVar45);
        auVar52 = *(undefined1 (*) [32])(lVar28 + 0x2200430 + lVar29 * 4);
        auVar56 = *(undefined1 (*) [32])(lVar28 + 0x22008b4 + lVar29 * 4);
        auVar53 = vmulps_avx512vl(auVar78,auVar56);
        auVar54 = vmulps_avx512vl(auVar68,auVar56);
        auVar55 = vmulps_avx512vl(auVar71,auVar56);
        auVar57._4_4_ = fVar72 * auVar56._4_4_;
        auVar57._0_4_ = fVar72 * auVar56._0_4_;
        auVar57._8_4_ = fVar72 * auVar56._8_4_;
        auVar57._12_4_ = fVar72 * auVar56._12_4_;
        auVar57._16_4_ = fVar72 * auVar56._16_4_;
        auVar57._20_4_ = fVar72 * auVar56._20_4_;
        auVar57._24_4_ = fVar72 * auVar56._24_4_;
        auVar57._28_4_ = auVar56._28_4_;
        auVar56._4_4_ = uVar77;
        auVar56._0_4_ = uVar77;
        auVar56._8_4_ = uVar77;
        auVar56._12_4_ = uVar77;
        auVar56._16_4_ = uVar77;
        auVar56._20_4_ = uVar77;
        auVar56._24_4_ = uVar77;
        auVar56._28_4_ = uVar77;
        auVar56 = vfmadd231ps_avx512vl(auVar53,auVar52,auVar56);
        auVar53 = vfmadd231ps_avx512vl(auVar54,auVar52,auVar18);
        auVar55 = vfmadd231ps_avx512vl(auVar55,auVar52,auVar19);
        auVar44 = vfmadd231ps_fma(auVar57,auVar76,auVar52);
        auVar52 = *(undefined1 (*) [32])(lVar28 + 0x21fffac + lVar29 * 4);
        auVar54._4_4_ = uVar79;
        auVar54._0_4_ = uVar79;
        auVar54._8_4_ = uVar79;
        auVar54._12_4_ = uVar79;
        auVar54._16_4_ = uVar79;
        auVar54._20_4_ = uVar79;
        auVar54._24_4_ = uVar79;
        auVar54._28_4_ = uVar79;
        auVar56 = vfmadd231ps_avx512vl(auVar56,auVar52,auVar54);
        auVar57 = vfmadd231ps_avx512vl(auVar53,auVar52,auVar63);
        auVar54 = vfmadd231ps_avx512vl(auVar55,auVar52,auVar64);
        auVar53._4_4_ = fVar16;
        auVar53._0_4_ = fVar16;
        auVar53._8_4_ = fVar16;
        auVar53._12_4_ = fVar16;
        auVar53._16_4_ = fVar16;
        auVar53._20_4_ = fVar16;
        auVar53._24_4_ = fVar16;
        auVar53._28_4_ = fVar16;
        auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar52,auVar53);
        auVar52 = *(undefined1 (*) [32])(bspline_basis0 + lVar29 * 4 + lVar28);
        auVar56 = vfmadd231ps_avx512vl(auVar56,auVar52,auVar46);
        auVar57 = vfmadd231ps_avx512vl(auVar57,auVar52,auVar47);
        auVar53 = vfmadd231ps_avx512vl(auVar54,auVar52,auVar48);
        auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar52,auVar49);
        auVar52 = vminps_avx512vl(auVar58,auVar56);
        bVar5 = (byte)uVar23;
        auVar55._0_4_ = (uint)(bVar5 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar52._0_4_
        ;
        bVar6 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar6 * auVar58._4_4_ | (uint)!bVar6 * auVar52._4_4_;
        bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar6 * auVar58._8_4_ | (uint)!bVar6 * auVar52._8_4_;
        bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar6 * auVar58._12_4_ | (uint)!bVar6 * auVar52._12_4_;
        bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar6 * auVar58._16_4_ | (uint)!bVar6 * auVar52._16_4_;
        bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar6 * auVar58._20_4_ | (uint)!bVar6 * auVar52._20_4_;
        bVar6 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar6 * auVar58._24_4_ | (uint)!bVar6 * auVar52._24_4_;
        bVar6 = SUB81(uVar23 >> 7,0);
        auVar55._28_4_ = (uint)bVar6 * auVar58._28_4_ | (uint)!bVar6 * auVar52._28_4_;
        auVar58 = vminps_avx512vl(auVar59,auVar57);
        auVar52._0_4_ = (uint)(bVar5 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar58._0_4_
        ;
        bVar6 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar6 * auVar59._4_4_ | (uint)!bVar6 * auVar58._4_4_;
        bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar6 * auVar59._8_4_ | (uint)!bVar6 * auVar58._8_4_;
        bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar6 * auVar59._12_4_ | (uint)!bVar6 * auVar58._12_4_;
        bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar6 * auVar59._16_4_ | (uint)!bVar6 * auVar58._16_4_;
        bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar6 * auVar59._20_4_ | (uint)!bVar6 * auVar58._20_4_;
        bVar6 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar6 * auVar59._24_4_ | (uint)!bVar6 * auVar58._24_4_;
        bVar6 = SUB81(uVar23 >> 7,0);
        auVar52._28_4_ = (uint)bVar6 * auVar59._28_4_ | (uint)!bVar6 * auVar58._28_4_;
        auVar59 = vminps_avx512vl(auVar60,auVar53);
        auVar58._0_4_ = (uint)(bVar5 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar59._0_4_
        ;
        bVar6 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar6 * auVar60._4_4_ | (uint)!bVar6 * auVar59._4_4_;
        bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar6 * auVar60._8_4_ | (uint)!bVar6 * auVar59._8_4_;
        bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar58._12_4_ = (uint)bVar6 * auVar60._12_4_ | (uint)!bVar6 * auVar59._12_4_;
        bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar58._16_4_ = (uint)bVar6 * auVar60._16_4_ | (uint)!bVar6 * auVar59._16_4_;
        bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar58._20_4_ = (uint)bVar6 * auVar60._20_4_ | (uint)!bVar6 * auVar59._20_4_;
        bVar6 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar58._24_4_ = (uint)bVar6 * auVar60._24_4_ | (uint)!bVar6 * auVar59._24_4_;
        bVar6 = SUB81(uVar23 >> 7,0);
        auVar58._28_4_ = (uint)bVar6 * auVar60._28_4_ | (uint)!bVar6 * auVar59._28_4_;
        auVar60 = vmaxps_avx512vl(auVar50,auVar56);
        auVar59._0_4_ = (uint)(bVar5 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar60._0_4_
        ;
        bVar6 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar6 * auVar50._4_4_ | (uint)!bVar6 * auVar60._4_4_;
        bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar6 * auVar50._8_4_ | (uint)!bVar6 * auVar60._8_4_;
        bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar59._12_4_ = (uint)bVar6 * auVar50._12_4_ | (uint)!bVar6 * auVar60._12_4_;
        bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar59._16_4_ = (uint)bVar6 * auVar50._16_4_ | (uint)!bVar6 * auVar60._16_4_;
        bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar59._20_4_ = (uint)bVar6 * auVar50._20_4_ | (uint)!bVar6 * auVar60._20_4_;
        bVar6 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar59._24_4_ = (uint)bVar6 * auVar50._24_4_ | (uint)!bVar6 * auVar60._24_4_;
        bVar6 = SUB81(uVar23 >> 7,0);
        auVar59._28_4_ = (uint)bVar6 * auVar50._28_4_ | (uint)!bVar6 * auVar60._28_4_;
        auVar60 = vmaxps_avx512vl(auVar62,auVar57);
        auVar61._0_4_ = (uint)(bVar5 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar60._0_4_
        ;
        bVar6 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar61._4_4_ = (uint)bVar6 * auVar62._4_4_ | (uint)!bVar6 * auVar60._4_4_;
        bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar61._8_4_ = (uint)bVar6 * auVar62._8_4_ | (uint)!bVar6 * auVar60._8_4_;
        bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar61._12_4_ = (uint)bVar6 * auVar62._12_4_ | (uint)!bVar6 * auVar60._12_4_;
        bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar61._16_4_ = (uint)bVar6 * auVar62._16_4_ | (uint)!bVar6 * auVar60._16_4_;
        bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar61._20_4_ = (uint)bVar6 * auVar62._20_4_ | (uint)!bVar6 * auVar60._20_4_;
        bVar6 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar61._24_4_ = (uint)bVar6 * auVar62._24_4_ | (uint)!bVar6 * auVar60._24_4_;
        bVar6 = SUB81(uVar23 >> 7,0);
        auVar61._28_4_ = (uint)bVar6 * auVar62._28_4_ | (uint)!bVar6 * auVar60._28_4_;
        auVar60 = vmaxps_avx512vl(auVar51,auVar53);
        auVar62._0_4_ = (uint)(bVar5 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar60._0_4_
        ;
        bVar6 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar62._4_4_ = (uint)bVar6 * auVar51._4_4_ | (uint)!bVar6 * auVar60._4_4_;
        bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar62._8_4_ = (uint)bVar6 * auVar51._8_4_ | (uint)!bVar6 * auVar60._8_4_;
        bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar62._12_4_ = (uint)bVar6 * auVar51._12_4_ | (uint)!bVar6 * auVar60._12_4_;
        bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar62._16_4_ = (uint)bVar6 * auVar51._16_4_ | (uint)!bVar6 * auVar60._16_4_;
        bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar62._20_4_ = (uint)bVar6 * auVar51._20_4_ | (uint)!bVar6 * auVar60._20_4_;
        bVar6 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar62._24_4_ = (uint)bVar6 * auVar51._24_4_ | (uint)!bVar6 * auVar60._24_4_;
        bVar6 = SUB81(uVar23 >> 7,0);
        auVar62._28_4_ = (uint)bVar6 * auVar51._28_4_ | (uint)!bVar6 * auVar60._28_4_;
        auVar50._8_4_ = 0x7fffffff;
        auVar50._0_8_ = 0x7fffffff7fffffff;
        auVar50._12_4_ = 0x7fffffff;
        auVar50._16_4_ = 0x7fffffff;
        auVar50._20_4_ = 0x7fffffff;
        auVar50._24_4_ = 0x7fffffff;
        auVar50._28_4_ = 0x7fffffff;
        vandps_avx512vl(ZEXT1632(auVar44),auVar50);
        auVar60 = vmaxps_avx512vl(auVar84,auVar62);
        bVar6 = (bool)((byte)(uVar23 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar23 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar23 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar23 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar23 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar23 >> 6) & 1);
        bVar12 = SUB81(uVar23 >> 7,0);
        auVar85 = ZEXT3264(CONCAT428((uint)bVar12 * auVar85._28_4_ | (uint)!bVar12 * auVar60._28_4_,
                                     CONCAT424((uint)bVar11 * auVar85._24_4_ |
                                               (uint)!bVar11 * auVar60._24_4_,
                                               CONCAT420((uint)bVar10 * auVar85._20_4_ |
                                                         (uint)!bVar10 * auVar60._20_4_,
                                                         CONCAT416((uint)bVar9 * auVar85._16_4_ |
                                                                   (uint)!bVar9 * auVar60._16_4_,
                                                                   CONCAT412((uint)bVar8 *
                                                                             auVar85._12_4_ |
                                                                             (uint)!bVar8 *
                                                                             auVar60._12_4_,
                                                                             CONCAT48((uint)bVar7 *
                                                                                      auVar85._8_4_
                                                                                      | (uint)!bVar7
                                                                                        * auVar60.
                                                  _8_4_,CONCAT44((uint)bVar6 * auVar85._4_4_ |
                                                                 (uint)!bVar6 * auVar60._4_4_,
                                                                 (uint)(bVar5 & 1) * auVar85._0_4_ |
                                                                 (uint)!(bool)(bVar5 & 1) *
                                                                 auVar60._0_4_))))))));
        auVar60 = auVar58;
        auVar50 = auVar59;
        auVar59 = auVar52;
        auVar51 = auVar62;
        auVar58 = auVar55;
        auVar62 = auVar61;
      }
      auVar63 = vshufps_avx512vl(auVar58,auVar58,0xb1);
      auVar64 = vminps_avx512vl(auVar58,auVar63);
      auVar63 = vshufpd_avx(auVar64,auVar64,5);
      auVar63 = vminps_avx(auVar64,auVar63);
      auVar44 = vminps_avx(auVar63._0_16_,auVar63._16_16_);
      auVar63 = vshufps_avx512vl(auVar59,auVar59,0xb1);
      auVar64 = vminps_avx512vl(auVar59,auVar63);
      auVar63 = vshufpd_avx(auVar64,auVar64,5);
      auVar63 = vminps_avx(auVar64,auVar63);
      auVar43 = vminps_avx(auVar63._0_16_,auVar63._16_16_);
      auVar43 = vunpcklps_avx(auVar44,auVar43);
      auVar63 = vshufps_avx(auVar60,auVar60,0xb1);
      auVar63 = vminps_avx(auVar60,auVar63);
      auVar64 = vshufpd_avx(auVar63,auVar63,5);
      auVar63 = vminps_avx(auVar63,auVar64);
      auVar44 = vminps_avx(auVar63._0_16_,auVar63._16_16_);
      auVar44 = vinsertps_avx(auVar43,auVar44,0x28);
      auVar63 = vshufps_avx(auVar50,auVar50,0xb1);
      auVar63 = vmaxps_avx(auVar50,auVar63);
      auVar64 = vshufpd_avx(auVar63,auVar63,5);
      auVar63 = vmaxps_avx(auVar63,auVar64);
      auVar43 = vmaxps_avx(auVar63._0_16_,auVar63._16_16_);
      auVar63 = vshufps_avx512vl(auVar62,auVar62,0xb1);
      auVar64 = vmaxps_avx512vl(auVar62,auVar63);
      auVar63 = vshufpd_avx(auVar64,auVar64,5);
      auVar63 = vmaxps_avx(auVar64,auVar63);
      auVar40 = vmaxps_avx(auVar63._0_16_,auVar63._16_16_);
      auVar40 = vunpcklps_avx(auVar43,auVar40);
      auVar63 = vshufps_avx512vl(auVar51,auVar51,0xb1);
      auVar64 = vmaxps_avx512vl(auVar51,auVar63);
      auVar63 = vshufpd_avx(auVar64,auVar64,5);
      auVar63 = vmaxps_avx(auVar64,auVar63);
      auVar43 = vmaxps_avx(auVar63._0_16_,auVar63._16_16_);
      auVar43 = vinsertps_avx(auVar40,auVar43,0x28);
      auVar63 = vshufps_avx512vl(auVar84,auVar84,0xb1);
      auVar64 = vmaxps_avx512vl(auVar84,auVar63);
      auVar63 = vshufpd_avx(auVar64,auVar64,5);
      auVar63 = vmaxps_avx(auVar64,auVar63);
      auVar40 = vmaxps_avx(auVar63._0_16_,auVar63._16_16_);
      fVar72 = auVar40._0_4_;
      auVar41._4_4_ = fVar72;
      auVar41._0_4_ = fVar72;
      auVar41._8_4_ = fVar72;
      auVar41._12_4_ = fVar72;
      auVar44 = vsubps_avx(auVar44,auVar41);
      auVar40._0_4_ = auVar43._0_4_ + fVar72;
      auVar40._4_4_ = auVar43._4_4_ + fVar72;
      auVar40._8_4_ = auVar43._8_4_ + fVar72;
      auVar40._12_4_ = auVar43._12_4_ + fVar72;
    }
    auVar43 = vandps_avx(auVar44,auVar69);
    auVar41 = vandps_avx(auVar40,auVar69);
    auVar43 = vmaxps_avx(auVar43,auVar41);
    auVar41 = vmovshdup_avx(auVar43);
    auVar41 = vmaxss_avx(auVar41,auVar43);
    auVar43 = vshufpd_avx(auVar43,auVar43,1);
    auVar43 = vmaxss_avx(auVar43,auVar41);
    fVar72 = auVar43._0_4_ * 4.7683716e-07;
    auVar31._4_4_ = fVar72;
    auVar31._0_4_ = fVar72;
    auVar31._8_4_ = fVar72;
    auVar31._12_4_ = fVar72;
    auVar44 = vsubps_avx(auVar44,auVar31);
    aVar14 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar44,ZEXT416(geomID),0x30);
    auVar67._0_4_ = auVar40._0_4_ + fVar72;
    auVar67._4_4_ = auVar40._4_4_ + fVar72;
    auVar67._8_4_ = auVar40._8_4_ + fVar72;
    auVar67._12_4_ = auVar40._12_4_ + fVar72;
    aVar15 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar67,ZEXT416((uint)uVar25),0x30);
    auVar44 = vminps_avx512vl((undefined1  [16])auVar83._0_16_,(undefined1  [16])aVar14);
    auVar83 = ZEXT1664(auVar44);
    auVar44 = vmaxps_avx512vl((undefined1  [16])auVar82._0_16_,(undefined1  [16])aVar15);
    auVar82 = ZEXT1664(auVar44);
    auVar74._0_4_ = aVar14.x + aVar15.x;
    auVar74._4_4_ = aVar14.y + aVar15.y;
    auVar74._8_4_ = aVar14.z + aVar15.z;
    auVar74._12_4_ = aVar14.field_3.w + aVar15.field_3.w;
    auVar44 = vminps_avx((undefined1  [16])auVar66._0_16_,auVar74);
    auVar66 = ZEXT1664(auVar44);
    auVar44 = vmaxps_avx((undefined1  [16])auVar65._0_16_,auVar74);
    auVar65 = ZEXT1664(auVar44);
    local_168 = local_168 + 1;
    prims[local_160].upper.field_0.field_1 = aVar15;
    prims[local_160].lower.field_0.field_1 = aVar14;
    local_160 = local_160 + 1;
  }
  else {
    lVar28 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar27);
    lVar29 = *(long *)((long)&(pBVar2->super_RawBufferView).stride + lVar27);
    lVar26 = lVar29 * (ulong)uVar1;
    auVar44 = vandps_avx(auVar80,ZEXT416(*(uint *)(lVar28 + 0xc + lVar26)));
    if (auVar44._0_4_ < 1.844e+18) {
      lVar22 = lVar29 * (ulong)(uVar1 + 1);
      auVar44 = vandps_avx(auVar80,ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)));
      if (auVar44._0_4_ < 1.844e+18) {
        lVar24 = lVar29 * (ulong)(uVar1 + 2);
        auVar44 = vandps_avx(auVar80,ZEXT416(*(uint *)(lVar28 + 0xc + lVar24)));
        if (auVar44._0_4_ < 1.844e+18) {
          auVar44 = vandps_avx(auVar80,ZEXT416(*(uint *)(lVar28 + 0xc + lVar29 * uVar23)));
          if (auVar44._0_4_ < 1.844e+18) {
            auVar44 = *(undefined1 (*) [16])(lVar28 + lVar26);
            uVar20 = vcmpps_avx512vl(auVar44,auVar81,6);
            uVar21 = vcmpps_avx512vl(auVar44,auVar30,1);
            if ((~((ushort)uVar20 & (ushort)uVar21) & 7) == 0) {
              auVar44 = *(undefined1 (*) [16])(lVar28 + lVar22);
              uVar20 = vcmpps_avx512vl(auVar44,auVar81,6);
              uVar21 = vcmpps_avx512vl(auVar44,auVar30,1);
              if ((~((ushort)uVar20 & (ushort)uVar21) & 7) == 0) {
                auVar44 = *(undefined1 (*) [16])(lVar28 + lVar24);
                uVar20 = vcmpps_avx512vl(auVar44,auVar81,6);
                uVar21 = vcmpps_avx512vl(auVar44,auVar30,1);
                if ((~((ushort)uVar20 & (ushort)uVar21) & 7) == 0) goto code_r0x01c1ab10;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_01c1ae07;
code_r0x01c1ab10:
  auVar44 = *(undefined1 (*) [16])(lVar28 + lVar29 * uVar23);
  uVar20 = vcmpps_avx512vl(auVar44,auVar81,6);
  uVar21 = vcmpps_avx512vl(auVar44,auVar30,1);
  lVar27 = lVar27 + 0x38;
  if ((~((ushort)uVar20 & (ushort)uVar21) & 7) != 0) goto LAB_01c1ae07;
  goto LAB_01c1aa1d;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }